

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_pax.c
# Opt level: O2

int archive_write_pax_options(archive_write *a,char *key,char *val)

{
  void *pvVar1;
  int iVar2;
  archive_string_conv *paVar3;
  char *fmt;
  
  pvVar1 = a->format_data;
  iVar2 = strcmp(key,"hdrcharset");
  if (iVar2 != 0) {
    return -0x14;
  }
  if ((val == (char *)0x0) || (*val == '\0')) {
    fmt = "pax: hdrcharset option needs a character-set name";
  }
  else {
    iVar2 = strcmp(val,"BINARY");
    if ((iVar2 == 0) || (iVar2 = strcmp(val,"binary"), iVar2 == 0)) {
      *(undefined4 *)((long)pvVar1 + 0x78) = 1;
      return 0;
    }
    iVar2 = strcmp(val,"UTF-8");
    if (iVar2 == 0) {
      paVar3 = archive_string_conversion_to_charset(&a->archive,"UTF-8",L'\0');
      *(archive_string_conv **)((long)pvVar1 + 0x70) = paVar3;
      if (paVar3 == (archive_string_conv *)0x0) {
        return -0x1e;
      }
      return 0;
    }
    fmt = "pax: invalid charset name";
  }
  archive_set_error(&a->archive,-1,fmt);
  return -0x19;
}

Assistant:

static int
archive_write_pax_options(struct archive_write *a, const char *key,
    const char *val)
{
	struct pax *pax = (struct pax *)a->format_data;
	int ret = ARCHIVE_FAILED;

	if (strcmp(key, "hdrcharset")  == 0) {
		/*
		 * The character-set we can use are defined in
		 * IEEE Std 1003.1-2001
		 */
		if (val == NULL || val[0] == 0)
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: hdrcharset option needs a character-set name");
		else if (strcmp(val, "BINARY") == 0 ||
		    strcmp(val, "binary") == 0) {
			/*
			 * Specify binary mode. We will not convert
			 * filenames, uname and gname to any charsets.
			 */
			pax->opt_binary = 1;
			ret = ARCHIVE_OK;
		} else if (strcmp(val, "UTF-8") == 0) {
			/*
			 * Specify UTF-8 character-set to be used for
			 * filenames. This is almost the test that
			 * running platform supports the string conversion.
			 * Especially libarchive_test needs this trick for
			 * its test.
			 */
			pax->sconv_utf8 = archive_string_conversion_to_charset(
			    &(a->archive), "UTF-8", 0);
			if (pax->sconv_utf8 == NULL)
				ret = ARCHIVE_FATAL;
			else
				ret = ARCHIVE_OK;
		} else
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "pax: invalid charset name");
		return (ret);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}